

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_in_struct
          (CompilerHLSL *this,SPIRVariable *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  uint uVar1;
  ExecutionModel EVar2;
  StorageClass SVar3;
  undefined1 *puVar4;
  bool bVar5;
  string *psVar6;
  SPIRVariable *pSVar7;
  bool bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  SPIREntryPoint *pSVar11;
  SPIRType *pSVar12;
  undefined4 *puVar13;
  size_type sVar14;
  Bitset *pBVar15;
  runtime_error *prVar16;
  undefined4 uVar17;
  __hashtable *__h;
  bool bVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3;
  string effective_semantic;
  string name;
  string binding;
  string semantic;
  SPIRType newtype;
  SPIRType type;
  uint local_3c4;
  SPIRVariable *local_3c0;
  undefined1 local_3b8 [32];
  SPIREntryPoint *local_398;
  undefined1 local_390 [32];
  __node_base local_370 [2];
  _Hash_node_base local_360 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310;
  undefined1 local_2f0 [32];
  uint *local_2d0;
  size_t local_2c8;
  uint local_2b8 [8];
  bool *local_298;
  size_t local_290;
  bool local_280 [24];
  TypedID<(spirv_cross::Types)1> *local_268;
  size_t local_260;
  TypedID<(spirv_cross::Types)1> local_250 [8];
  uint *local_230;
  size_t local_228;
  uint local_218 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1d8;
  string local_1a0;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pSVar11 = Compiler::get_entry_point((Compiler *)this);
  pSVar12 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr +
                       *(uint *)&(var->super_IVariant).field_0xc);
  SPIRType::SPIRType((SPIRType *)local_180,pSVar12);
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  local_350._M_string_length = 0;
  local_350.field_2._M_local_buf[0] = '\0';
  uVar1 = (this->hlsl_options).shader_model;
  EVar2 = pSVar11->model;
  SVar3 = var->storage;
  bVar8 = SVar3 != StorageClassOutput;
  bVar5 = EVar2 != ExecutionModelFragment;
  local_3c0 = var;
  local_398 = pSVar11;
  if (SVar3 == StorageClassOutput && EVar2 == ExecutionModelFragment) {
    uVar9 = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationIndex);
    uVar10 = Compiler::get_decoration
                       ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    if (uVar10 != 0 && uVar9 != 0) {
      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_2f0._0_8_ = local_2f0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f0,"Dual-source blending is only supported on MRT #0 in HLSL.","")
      ;
      ::std::runtime_error::runtime_error(prVar16,(string *)local_2f0);
      *(undefined ***)prVar16 = &PTR__runtime_error_003fce08;
      __cxa_throw(prVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_370[0]._M_nxt = (_Hash_node_base *)0x368063;
    if (0x1e < uVar1) {
      local_370[0]._M_nxt = (_Hash_node_base *)0x368069;
    }
    local_310._M_dataplus._M_p._0_4_ = uVar10 + uVar9;
    join<char_const*,unsigned_int>
              ((string *)local_2f0,(spirv_cross *)local_370,(char **)&local_310,(uint *)"SV_Target")
    ;
    ::std::__cxx11::string::operator=((string *)&local_350,(string *)local_2f0);
    if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
      operator_delete((void *)local_2f0._0_8_);
    }
    if (0x1e < uVar1) {
      bVar18 = false;
      goto LAB_0026024e;
    }
    puVar13 = (undefined4 *)(local_180 + 0x14);
    uVar17 = 4;
  }
  else {
    bVar18 = EVar2 == ExecutionModelVertex && SVar3 == StorageClassInput;
    if ((EVar2 != ExecutionModelVertex || SVar3 != StorageClassInput) || 0x1e < uVar1)
    goto LAB_0026024e;
    puVar13 = (undefined4 *)(local_180 + 0xc);
    uVar17 = 0xd;
  }
  *puVar13 = uVar17;
  bVar18 = bVar8 || bVar5;
LAB_0026024e:
  pSVar7 = local_3c0;
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (local_370,this,(ulong)(local_3c0->super_IVariant).self.id,1);
  if (bVar8 || bVar5) {
    bVar8 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(pSVar7->super_IVariant).self.id,DecorationLocation);
    if (bVar8) {
      uVar9 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(local_3c0->super_IVariant).self.id,DecorationLocation
                        );
    }
    else {
      local_2f0._0_8_ = local_2f0._0_8_ & 0xffffffff00000000;
      bVar8 = false;
      do {
        sVar14 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&active_locations->_M_h,(key_type *)local_2f0);
        uVar9 = local_2f0._0_4_;
        if (sVar14 == 0) break;
        uVar1 = local_2f0._0_4_ + 1;
        local_2f0._0_4_ = uVar1;
        bVar8 = uVar1 >= 0x40;
      } while (uVar1 < 0x40);
      if (bVar8) {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_2f0._0_8_ = local_2f0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2f0,"All locations from 0 to 63 are exhausted.","");
        ::std::runtime_error::runtime_error(prVar16,(string *)local_2f0);
        *(undefined ***)prVar16 = &PTR__runtime_error_003fce08;
        __cxa_throw(prVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)local_3c0->storage;
    to_semantic_abi_cxx11_(&local_310,this,uVar9,local_398->model,local_3c0->storage);
    if ((bool)(bVar18 & 1 < (uint)local_180._24_4_)) {
      if (local_180._40_8_ != 0) {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_2f0._0_8_ = local_2f0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2f0,
                   "Arrays of matrices used as input/output. This is not supported.","");
        ::std::runtime_error::runtime_error(prVar16,(string *)local_2f0);
        *(undefined ***)prVar16 = &PTR__runtime_error_003fce08;
        __cxa_throw(prVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_3c4 = 0;
      if (local_180._24_4_ != 0) {
        do {
          SPIRType::SPIRType((SPIRType *)local_2f0,(SPIRType *)local_180);
          local_2f0._24_4_ = 1;
          local_3b8._0_8_ = local_3b8 + 0x10;
          local_3b8._8_8_ = 0;
          local_3b8[0x10] = '\0';
          if ((this->hlsl_options).flatten_matrix_vertex_input_semantics == true) {
            ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (ulong)local_3c0->storage;
            to_semantic_abi_cxx11_
                      ((string *)local_390,this,uVar9,local_398->model,local_3c0->storage);
          }
          else {
            join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                      ((string *)local_390,(spirv_cross *)&local_310,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36aaac
                       ,(char (*) [2])&local_3c4,(uint *)ts_3);
          }
          ::std::__cxx11::string::operator=((string *)local_3b8,(string *)local_390);
          if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)local_390._0_8_ !=
              (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)(local_390 + 0x10)) {
            operator_delete((void *)local_390._0_8_);
          }
          pBVar15 = Compiler::get_decoration_bitset
                              ((Compiler *)this,(ID)(local_3c0->super_IVariant).self.id);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x34])
                    ((string *)local_390,this,pBVar15);
          join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                    (&local_1a0,(spirv_cross *)local_370,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36aaac,
                     (char (*) [2])&local_3c4,(uint *)ts_3);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                    (&local_330,this,local_2f0,&local_1a0,0);
          ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8;
          CompilerGLSL::
          statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(string *)local_390,&local_330,(char (*) [4])0x36d4a0
                     ,ts_3,(char (*) [2])0x365574);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_330._M_dataplus._M_p._4_4_,(uint32_t)local_330._M_dataplus._M_p) !=
              &local_330.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_330._M_dataplus._M_p._4_4_,
                                     (uint32_t)local_330._M_dataplus._M_p));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p);
          }
          if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)local_390._0_8_ !=
              (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)(local_390 + 0x10)) {
            operator_delete((void *)local_390._0_8_);
          }
          local_390._0_8_ = active_locations;
          local_330._M_dataplus._M_p._0_4_ = uVar9;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)active_locations,&local_330,(string *)local_390);
          if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)local_3b8._0_8_ !=
              (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)(local_3b8 + 0x10)) {
            operator_delete((void *)local_3b8._0_8_);
          }
          local_2f0._0_8_ = &PTR__SPIRType_003fd210;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_1d8);
          local_228 = 0;
          if (local_230 != local_218) {
            free(local_230);
          }
          local_260 = 0;
          if (local_268 != (TypedID<(spirv_cross::Types)1> *)(local_2f0 + 0xa0)) {
            free(local_268);
          }
          local_290 = 0;
          if (local_298 != (bool *)(local_2f0 + 0x70)) {
            free(local_298);
          }
          local_2c8 = 0;
          if (local_2d0 != (uint *)(local_2f0 + 0x38)) {
            free(local_2d0);
          }
          local_3c4 = local_3c4 + 1;
          uVar9 = uVar9 + 1;
        } while (local_3c4 < (uint)local_180._24_4_);
      }
    }
    else {
      SPIRType::SPIRType((SPIRType *)local_2f0,(SPIRType *)local_180);
      if (local_398->model == ExecutionModelMeshEXT) {
        if (local_2c8 != 1) {
          memmove(local_2d0,local_2d0 + 1,local_2c8 * 4 - 4);
        }
        local_2c8 = local_2c8 - 1;
        if (local_290 != 1) {
          memmove(local_298,local_298 + 1,local_290 - 1);
        }
        local_290 = local_290 - 1;
      }
      pBVar15 = Compiler::get_decoration_bitset
                          ((Compiler *)this,(ID)(local_3c0->super_IVariant).self.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x34])(local_3b8,this,pBVar15);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                (local_390,this,local_2f0,local_370,0);
      CompilerGLSL::
      statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                 (char (*) [4])0x36d4a0,&local_310,(char (*) [2])0x365574);
      if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)local_390._0_8_ !=
          (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)(local_390 + 0x10)) {
        operator_delete((void *)local_390._0_8_);
      }
      if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)local_3b8._0_8_ !=
          (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)(local_3b8 + 0x10)) {
        operator_delete((void *)local_3b8._0_8_);
      }
      uVar10 = type_to_consumed_locations(this,(SPIRType *)local_2f0);
      if (uVar10 != 0) {
        do {
          local_390._0_4_ = uVar9;
          local_3b8._0_8_ = active_locations;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)active_locations,local_390,local_3b8);
          uVar9 = uVar9 + 1;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      local_2f0._0_8_ = &PTR__SPIRType_003fd210;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_1d8);
      local_228 = 0;
      if (local_230 != local_218) {
        free(local_230);
      }
      local_260 = 0;
      if (local_268 != (TypedID<(spirv_cross::Types)1> *)(local_2f0 + 0xa0)) {
        free(local_268);
      }
      local_290 = 0;
      if (local_298 != (bool *)(local_2f0 + 0x70)) {
        free(local_298);
      }
      local_2c8 = 0;
      if (local_2d0 != (uint *)(local_2f0 + 0x38)) {
        free(local_2d0);
      }
    }
    psVar6 = &local_310;
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
              (local_2f0,this,local_180,local_370,0);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
               (char (*) [4])0x36d4a0,&local_350,(char (*) [2])0x365574);
    psVar6 = (string *)local_2f0;
  }
  puVar4 = *(undefined1 **)((psVar6->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4 != &psVar6->field_2) {
    operator_delete(puVar4);
  }
  if (local_370[0]._M_nxt != local_360) {
    operator_delete(local_370[0]._M_nxt);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  local_180._0_8_ = &PTR__SPIRType_003fd210;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_in_struct(const SPIRVariable &var, unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);

	string binding;
	bool use_location_number = true;
	bool need_matrix_unroll = false;
	bool legacy = hlsl_options.shader_model <= 30;
	if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
	{
		// Dual-source blending is achieved in HLSL by emitting to SV_Target0 and 1.
		uint32_t index = get_decoration(var.self, DecorationIndex);
		uint32_t location = get_decoration(var.self, DecorationLocation);

		if (index != 0 && location != 0)
			SPIRV_CROSS_THROW("Dual-source blending is only supported on MRT #0 in HLSL.");

		binding = join(legacy ? "COLOR" : "SV_Target", location + index);
		use_location_number = false;
		if (legacy) // COLOR must be a four-component vector on legacy shader model targets (HLSL ERR_COLOR_4COMP)
			type.vecsize = 4;
	}
	else if (var.storage == StorageClassInput && execution.model == ExecutionModelVertex)
	{
		need_matrix_unroll = true;
		if (legacy) // Inputs must be floating-point in legacy targets.
			type.basetype = SPIRType::Float;
	}

	const auto get_vacant_location = [&]() -> uint32_t {
		for (uint32_t i = 0; i < 64; i++)
			if (!active_locations.count(i))
				return i;
		SPIRV_CROSS_THROW("All locations from 0 to 63 are exhausted.");
	};

	auto name = to_name(var.self);
	if (use_location_number)
	{
		uint32_t location_number;

		// If an explicit location exists, use it with TEXCOORD[N] semantic.
		// Otherwise, pick a vacant location.
		if (has_decoration(var.self, DecorationLocation))
			location_number = get_decoration(var.self, DecorationLocation);
		else
			location_number = get_vacant_location();

		// Allow semantic remap if specified.
		auto semantic = to_semantic(location_number, execution.model, var.storage);

		if (need_matrix_unroll && type.columns > 1)
		{
			if (!type.array.empty())
				SPIRV_CROSS_THROW("Arrays of matrices used as input/output. This is not supported.");

			// Unroll matrices.
			for (uint32_t i = 0; i < type.columns; i++)
			{
				SPIRType newtype = type;
				newtype.columns = 1;

				string effective_semantic;
				if (hlsl_options.flatten_matrix_vertex_input_semantics)
					effective_semantic = to_semantic(location_number, execution.model, var.storage);
				else
					effective_semantic = join(semantic, "_", i);

				statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)),
				          variable_decl(newtype, join(name, "_", i)), " : ", effective_semantic, ";");
				active_locations.insert(location_number++);
			}
		}
		else
		{
			auto decl_type = type;
			if (execution.model == ExecutionModelMeshEXT)
			{
				decl_type.array.erase(decl_type.array.begin());
				decl_type.array_size_literal.erase(decl_type.array_size_literal.begin());
			}
			statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)), variable_decl(decl_type, name), " : ",
			          semantic, ";");

			// Structs and arrays should consume more locations.
			uint32_t consumed_locations = type_to_consumed_locations(decl_type);
			for (uint32_t i = 0; i < consumed_locations; i++)
				active_locations.insert(location_number + i);
		}
	}
	else
	{
		statement(variable_decl(type, name), " : ", binding, ";");
	}
}